

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O3

void __thiscall LightBounds_Basics_Test::TestBody(LightBounds_Basics_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Float FVar3;
  Point3f p;
  Point3f p_00;
  Point3f p_01;
  Point3f p_02;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  internal local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  float local_44;
  undefined1 local_40 [44];
  Float local_14;
  bool local_10;
  
  local_40._0_4_ = 0.0;
  local_40._4_4_ = 0.0;
  local_40._8_4_ = 0.0;
  local_40._12_32_ =
       vunpcklpd_avx(ZEXT1632(CONCAT412(0x3dcccccd,CONCAT48(0x3dcccccd,0x3dcccccd3dcccccd))),
                     _DAT_0054fa40);
  local_14 = -4.371139e-08;
  local_10 = false;
  p.super_Tuple3<pbrt::Point3,_float>.z = 1.0;
  p.super_Tuple3<pbrt::Point3,_float>.x = 1.0;
  p.super_Tuple3<pbrt::Point3,_float>.y = 1.0;
  local_68.ptr_._0_4_ =
       pbrt::LightBounds::Importance((LightBounds *)local_40,p,(Normal3f)ZEXT812(0));
  local_60.data_._0_4_ = 0.0;
  testing::internal::CmpHelperGT<float,int>
            (local_58,"bounds.Importance(intr.p(), intr.n)","0",(float *)&local_68,(int *)&local_60)
  ;
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
               ,0xb9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  p_00.super_Tuple3<pbrt::Point3,_float>.z = -1.0;
  p_00.super_Tuple3<pbrt::Point3,_float>.x = 1.0;
  p_00.super_Tuple3<pbrt::Point3,_float>.y = 1.0;
  FVar3 = pbrt::LightBounds::Importance((LightBounds *)local_40,p_00,(Normal3f)ZEXT812(0));
  local_68.ptr_._0_4_ = FVar3;
  local_60.data_._0_4_ = 0.0;
  testing::internal::CmpHelperEQ<float,int>
            (local_58,"bounds.Importance(intr.p(), intr.n)","0",(float *)&local_68,(int *)&local_60)
  ;
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
               ,0xbf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  p_01.super_Tuple3<pbrt::Point3,_float>.z = 1.0;
  p_01.super_Tuple3<pbrt::Point3,_float>.x = 1.0;
  p_01.super_Tuple3<pbrt::Point3,_float>.y = 1.0;
  local_44 = pbrt::LightBounds::Importance((LightBounds *)local_40,p_01,(Normal3f)ZEXT812(0));
  p_02.super_Tuple3<pbrt::Point3,_float>.z = 0.02;
  p_02.super_Tuple3<pbrt::Point3,_float>.x = 1.0;
  p_02.super_Tuple3<pbrt::Point3,_float>.y = 1.0;
  FVar3 = pbrt::LightBounds::Importance((LightBounds *)local_40,p_02,(Normal3f)ZEXT812(0));
  local_60.data_._0_4_ = FVar3 / local_44;
  local_68.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3fc999999999999a;
  testing::internal::CmpHelperLT<float,double>
            (local_58,"impLow / impHigh",".2",(float *)&local_60,(double *)&local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
               ,0xcc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(LightBounds, Basics) {
    LightBounds bounds(Bounds3f(Point3f(0, 0, 0), Point3f(.1, .1, .01)),
                       Vector3f(0, 0, 1), 1.f /* phi */, std::cos(0.f) /* theta_o: normal spread */,
                       std::cos(Pi / 2) /* theta_e: falloff given visible normal */,
                       false /* two-sided */);

    // Positive importance for point on the emissive side
    {
        Interaction intr(Point3f(1, 1, 1), 0.f /* time */, (MediumInterface *)nullptr);
        EXPECT_GT(bounds.Importance(intr.p(), intr.n), 0);
    }

    // Zero importance for point on the non-emissive side
    {
        Interaction intr(Point3f(1, 1, -1), 0.f /* time */, (MediumInterface *)nullptr);
        EXPECT_EQ(bounds.Importance(intr.p(), intr.n), 0);
    }

    // Low importance when close to the emitter's plane (since cos theta)
    {
        Interaction intrHigh(Point3f(1, 1, 1), 0.f /* time */,
                             (MediumInterface *)nullptr);
        Float impHigh = bounds.Importance(intrHigh.p(), intrHigh.n);

        Interaction intrLow(Point3f(1, 1, .02), 0.f /* time */,
                            (MediumInterface *)nullptr);
        Float impLow = bounds.Importance(intrLow.p(), intrLow.n);

        EXPECT_LT(impLow / impHigh, .2);
    }
}